

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

void cppqc::detail::outputLabels
               (ostream *out,size_t numSuccess,
               multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *labels)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  pointer ppVar4;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  const_reverse_iterator it;
  size_t cnt;
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  long local_20;
  
  local_20 = 0x14;
  std::
  multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::rbegin(in_stack_ffffffffffffffa8);
  while( true ) {
    std::
    multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::rend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return;
    }
    if (local_20 == 0) break;
    std::
    reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffffb0);
    bVar1 = std::operator!=(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      in_stack_ffffffffffffffb0 = in_RDI;
      _Var2 = Catch::clara::std::setw(3);
      poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffffb0,_Var2);
      ppVar4 = std::
               reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffffb0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ppVar4->first * 100) / in_RSI);
      poVar3 = std::operator<<(poVar3,"% ");
      ppVar4 = std::
               reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffffb0);
      poVar3 = std::operator<<(poVar3,(string *)&ppVar4->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    local_20 = local_20 + -1;
    std::
    reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_ffffffffffffffb0);
  }
  poVar3 = std::operator<<((ostream *)in_RDI,"  ...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline void outputLabels(
    std::ostream& out,
    std::size_t numSuccess,
    const std::multimap<std::size_t, std::string>& labels) {
  std::size_t cnt = 20;
  for (auto it = labels.rbegin(); it != labels.rend(); --cnt, ++it) {
    if (cnt == 0) {
      out << "  ..." << std::endl;
      break;
    }

    if (it->second != "") {
      out << std::setw(3) << (100 * it->first / numSuccess) << "% "
          << it->second << std::endl;
    }
  }
}